

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  optional<wabt::Token> *poVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  Token local_58;
  
  uVar9 = (ulong)(this->tokens_).i;
  if ((this->tokens_).tokens._M_elems[uVar9].super__Optional_base<wabt::Token,_true,_true>.
      _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
    WastLexer::GetToken(&local_58,this->lexer_);
    uVar9 = (ulong)(this->tokens_).i;
    uVar10 = uVar9 ^ 1;
    if ((this->tokens_).tokens._M_elems[uVar10].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true) {
      __assert_fail("!tokens[!i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
    }
    poVar1 = (this->tokens_).tokens._M_elems + uVar10;
    *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x30) =
         local_58.field_2.text_._M_str;
    *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 0x38) =
         local_58.field_2.literal_.text._M_str;
    *(undefined8 *)
     ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x20) = local_58._32_8_;
    *(size_t *)
     ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x28) =
         local_58.field_2.text_._M_len;
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
            super__Optional_payload_base<wabt::Token>._M_payload + 0x10))->offset =
         (size_t)local_58.loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x18) =
         local_58.loc.field_1._8_8_;
    *(size_t *)
     &(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_payload = local_58.loc.filename._M_len;
    *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                      super__Optional_payload_base<wabt::Token>._M_payload + 8) =
         local_58.loc.filename._M_str;
    (poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
    super__Optional_payload_base<wabt::Token>._M_engaged = true;
    if ((this->tokens_).tokens._M_elems[uVar9].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
      (this->tokens_).i = SUB81(uVar10,0);
      uVar9 = uVar10;
    }
  }
  if ((this->tokens_).tokens._M_elems[uVar9].super__Optional_base<wabt::Token,_true,_true>.
      _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged != false) {
    poVar1 = (this->tokens_).tokens._M_elems + uVar9;
    sVar2 = *(size_t *)
             &(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
              super__Optional_payload_base<wabt::Token>._M_payload;
    pcVar3 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload + 8);
    sVar4 = *(size_t *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x10);
    uVar5 = *(undefined8 *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x18);
    uVar6 = *(undefined8 *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x20);
    sVar7 = *(size_t *)
             ((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                     super__Optional_payload_base<wabt::Token>._M_payload + 0x28);
    pcVar8 = *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                               super__Optional_payload_base<wabt::Token>._M_payload + 0x38);
    (__return_storage_ptr__->field_2).text_._M_str =
         *(char **)((long)&(poVar1->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
                           super__Optional_payload_base<wabt::Token>._M_payload + 0x30);
    (__return_storage_ptr__->field_2).literal_.text._M_str = pcVar8;
    *(undefined8 *)&__return_storage_ptr__->token_type_ = uVar6;
    (__return_storage_ptr__->field_2).text_._M_len = sVar7;
    (__return_storage_ptr__->loc).field_1.field_1.offset = sVar4;
    *(undefined8 *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = uVar5;
    (__return_storage_ptr__->loc).filename._M_len = sVar2;
    (__return_storage_ptr__->loc).filename._M_str = pcVar3;
    return __return_storage_ptr__;
  }
  std::__throw_bad_optional_access();
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken());
  }
  return tokens_.front();
}